

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O0

QString * QMakeInternal::IoUtils::shellQuoteUnix(QString *arg)

{
  bool bVar1;
  qsizetype qVar2;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QString *ret;
  QString *in_stack_ffffffffffffff98;
  QString *arg_00;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar4;
  QLatin1Char local_37 [4];
  QLatin1Char local_33 [3];
  CaseSensitivity local_30;
  QLatin1Char local_1b;
  ushort local_1a;
  storage_type *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  arg_00 = in_RDI;
  qVar2 = QString::size(in_RSI);
  if (qVar2 == 0) {
    QByteArrayView::QByteArrayView<3ul>
              ((QByteArrayView *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               (char (*) [3])arg_00);
    QVar3.m_data = local_18;
    QVar3.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar3);
  }
  else {
    uVar4 = 0;
    (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).size = -0x5555555555555556;
    QString::QString(in_RDI,in_stack_ffffffffffffff98);
    bVar1 = hasSpecialChars(arg_00,(uchar (*) [16])in_RDI);
    if (bVar1) {
      QLatin1Char::QLatin1Char(&local_1b,'\'');
      QChar::QChar<QLatin1Char,_true>((QChar *)in_RDI,(QLatin1Char)(char)((ulong)arg_00 >> 0x38));
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT17(uVar4,in_stack_ffffffffffffffb0),(char *)arg_00);
      QString::replace((QChar)(char16_t)in_RDI,(QLatin1String *)(ulong)local_1a,local_30);
      QLatin1Char::QLatin1Char(local_33,'\'');
      QChar::QChar<QLatin1Char,_true>((QChar *)in_RDI,(QLatin1Char)(char)((ulong)arg_00 >> 0x38));
      QString::prepend(in_RDI,(QChar)(char16_t)((ulong)arg_00 >> 0x30));
      QLatin1Char::QLatin1Char(local_37,'\'');
      QChar::QChar<QLatin1Char,_true>((QChar *)in_RDI,(QLatin1Char)(char)((ulong)arg_00 >> 0x38));
      QString::append((QChar)(char16_t)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return arg_00;
  }
  __stack_chk_fail();
}

Assistant:

QString IoUtils::shellQuoteUnix(const QString &arg)
{
    // Chars that should be quoted (TM). This includes:
    static const uchar iqm[] = {
        0xff, 0xff, 0xff, 0xff, 0xdf, 0x07, 0x00, 0xd8,
        0x00, 0x00, 0x00, 0x38, 0x01, 0x00, 0x00, 0x78
    }; // 0-32 \'"$`<>|;&(){}*?#!~[]

    if (!arg.size())
        return QString::fromLatin1("''");

    QString ret(arg);
    if (hasSpecialChars(ret, iqm)) {
        ret.replace(QLatin1Char('\''), QLatin1String("'\\''"));
        ret.prepend(QLatin1Char('\''));
        ret.append(QLatin1Char('\''));
    }
    return ret;
}